

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  lzham_compress_status_t lVar4;
  int iVar5;
  lzcompressor *this;
  ulong __n;
  task_pool *local_70;
  init_params local_58;
  
  lVar4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  if (pDst_len != (size_t *)0x0 && pParams != (lzham_compress_params *)0x0) {
    if ((src_len >> 0x20 == 0) && (pSrc_buf != (lzham_uint8 *)0x0 || src_len == 0)) {
      local_58.m_pTask_pool = (task_pool *)0x0;
      local_58.m_max_helper_threads = 0;
      local_58.m_compression_level = cCompressionLevelDefault;
      local_58.m_dict_size_log2 = 0x16;
      local_58.m_block_size = 0x80000;
      local_58.m_num_cachelines = 0;
      local_58.m_cacheline_size = 0;
      local_58.m_lzham_compress_flags = 0;
      lVar4 = create_init_params(&local_58,pParams);
      uVar2 = local_58._8_8_;
      if (lVar4 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        lVar4 = LZHAM_COMP_STATUS_FAILED;
        if (local_58.m_max_helper_threads == 0) {
          local_70 = (task_pool *)0x0;
        }
        else {
          local_70 = lzham_new<lzham::task_pool>();
          iVar5 = task_pool::init(local_70,(EVP_PKEY_CTX *)(uVar2 & 0xffffffff));
          local_58.m_pTask_pool = local_70;
          if ((char)iVar5 == '\0') {
            return LZHAM_COMP_STATUS_FAILED;
          }
        }
        this = lzham_new<lzham::lzcompressor>();
        if (this == (lzcompressor *)0x0) {
          lzham_delete<lzham::task_pool>(local_70);
        }
        else {
          iVar5 = lzcompressor::init(this,(EVP_PKEY_CTX *)&local_58);
          if ((char)iVar5 == '\0') {
            lzham_delete<lzham::task_pool>(local_70);
            lzham_delete<lzham::lzcompressor>(this);
            lVar4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
          }
          else if (((src_len == 0) ||
                   (bVar3 = lzcompressor::put_bytes(this,pSrc_buf,(uint)src_len), bVar3)) &&
                  (bVar3 = lzcompressor::put_bytes(this,(void *)0x0,0), bVar3)) {
            uVar1 = *pDst_len;
            __n = (ulong)(this->m_comp_buf).m_size;
            *pDst_len = __n;
            if (pAdler32 != (lzham_uint32 *)0x0) {
              *pAdler32 = this->m_src_adler32;
              __n = (ulong)(this->m_comp_buf).m_size;
            }
            if (uVar1 < __n) {
              lzham_delete<lzham::task_pool>(local_70);
              lzham_delete<lzham::lzcompressor>(this);
              lVar4 = LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
            }
            else {
              memcpy(pDst_buf,(this->m_comp_buf).m_p,__n);
              lzham_delete<lzham::task_pool>(local_70);
              lzham_delete<lzham::lzcompressor>(this);
              lVar4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
            }
          }
          else {
            *pDst_len = 0;
            lzham_delete<lzham::task_pool>(local_70);
            lzham_delete<lzham::lzcompressor>(this);
          }
        }
      }
    }
  }
  return lVar4;
}

Assistant:

lzham_compress_status_t lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;

      if (src_len)
      {
         if (!pSrc_buf)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > UINT32_MAX)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      lzcompressor::init_params params;
      lzham_compress_status_t status = create_init_params(params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
         return status;

      task_pool *pTP = NULL;
      if (params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>();
         if (!pTP->init(params.m_max_helper_threads))   
            return LZHAM_COMP_STATUS_FAILED;

         params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>();
      if (!pCompressor)
      {
         lzham_delete(pTP);
         return LZHAM_COMP_STATUS_FAILED;
      }
      
      if (!pCompressor->init(params))
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(pTP);
            lzham_delete(pCompressor);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(pTP);
      lzham_delete(pCompressor);
      return LZHAM_COMP_STATUS_SUCCESS;  
   }